

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O1

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,cmDuration testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment,Encoding encoding)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  pointer pbVar3;
  pointer ppcVar4;
  char *__s;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> _Var5;
  char cVar6;
  char cVar7;
  bool bVar8;
  uint __val;
  int iVar9;
  int iVar10;
  ostream *poVar11;
  string *psVar12;
  SaveRestoreEnvironment *pSVar13;
  cmsysProcess *pcVar14;
  size_t sVar15;
  pointer __dest;
  uint uVar16;
  ulong uVar17;
  pointer ppcVar18;
  pointer __p;
  cmDuration cVar19;
  cmProcessOutput processOutput;
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  saveEnv;
  vector<char,_std::allocator<char>_> tempOutput;
  int length;
  char *data;
  ostringstream msg;
  string strdata;
  ostringstream cmCTestLog_msg;
  undefined1 auStack_978 [7];
  cmProcessOutput local_971;
  cmCTest *local_970;
  cmsysProcess *local_968;
  _Head_base<0UL,_cmSystemTools::SaveRestoreEnvironment_*,_false> local_960;
  cmDuration local_958;
  undefined4 local_94c;
  vector<char,_std::allocator<char>_> local_948;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_928;
  int local_904;
  int *local_900;
  vector<char,_std::allocator<char>_> local_8f8;
  char *local_8d8;
  string *local_8d0;
  ostream *local_8c8;
  undefined1 local_8c0 [16];
  SaveRestoreEnvironment local_8b0 [4];
  ios_base local_850 [264];
  string local_748;
  string local_728 [3];
  ios_base local_6b8 [264];
  undefined1 local_5b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5a0 [6];
  ios_base local_540 [1024];
  cmDuration local_140;
  string *local_c8;
  string *local_c0;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_94c = 0;
  }
  else {
    pbVar3 = (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_94c = (undefined4)
                CONCAT71((int7)((ulong)pbVar3 >> 8),
                         pbVar3 != (environment->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_finish);
  }
  local_970 = this;
  local_968 = (cmsysProcess *)testTimeOut.__r;
  cVar19 = GetRemainingTimeAllowed(this);
  local_958.__r =
       (rep_conflict)
       (~-(ulong)(cVar19.__r != 10000000.0) & (ulong)cVar19.__r |
       (ulong)(cVar19.__r + -120.0) & -(ulong)(cVar19.__r != 10000000.0));
  dVar2 = (this->TimeOut).__r;
  if ((0.0 < dVar2) && (dVar2 < local_958.__r)) {
    local_958.__r = (local_970->TimeOut).__r;
  }
  if ((0.0 < (double)local_968) &&
     (cVar19 = GetRemainingTimeAllowed(local_970), (double)local_968 < cVar19.__r)) {
    local_958.__r = (rep_conflict)local_968;
  }
  if (local_958.__r <= 0.0) {
    local_958.__r = 1.0;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"Test timeout computed to be: ",0x1d);
  if ((local_958.__r != 10000000.0) || (NAN(local_958.__r))) {
    __val = cmDurationTo<unsigned_int>(&local_958);
    cVar7 = '\x01';
    if (9 < __val) {
      uVar16 = __val;
      cVar6 = '\x04';
      do {
        cVar7 = cVar6;
        if (uVar16 < 100) {
          cVar7 = cVar7 + -2;
          goto LAB_0014e992;
        }
        if (uVar16 < 1000) {
          cVar7 = cVar7 + -1;
          goto LAB_0014e992;
        }
        if (uVar16 < 10000) goto LAB_0014e992;
        bVar8 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar6 = cVar7 + '\x04';
      } while (bVar8);
      cVar7 = cVar7 + '\x01';
    }
LAB_0014e992:
    local_728[0]._M_dataplus._M_p = (pointer)&local_728[0].field_2;
    std::__cxx11::string::_M_construct((ulong)local_728,cVar7);
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_728[0]._M_dataplus._M_p,(uint)local_728[0]._M_string_length,__val);
  }
  else {
    local_728[0]._M_dataplus._M_p = (pointer)&local_728[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_728,"infinite","");
  }
  local_968 = (cmsysProcess *)environment;
  local_900 = retVal;
  poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_5b0,local_728[0]._M_dataplus._M_p,
                       local_728[0]._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\n",1);
  paVar1 = &local_728[0].field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_728[0]._M_dataplus._M_p,
                    CONCAT71(local_728[0].field_2._M_allocated_capacity._1_7_,
                             local_728[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::stringbuf::str();
  Log(local_970,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x487,local_728[0]._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_728[0]._M_dataplus._M_p,
                    CONCAT71(local_728[0].field_2._M_allocated_capacity._1_7_,
                             local_728[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_5b0,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator<char> *)local_728);
  psVar12 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar8 = cmsys::SystemTools::SameFile((string *)local_5b0,psVar12);
  if (bVar8) {
    bVar8 = local_970->ForceNewCTestProcess;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._0_8_ != local_5a0) {
      operator_delete((void *)local_5b0._0_8_,local_5a0[0]._M_allocated_capacity + 1);
    }
    if (bVar8 == false) {
      cmCTest((cmCTest *)local_5b0);
      std::__cxx11::string::_M_assign((string *)(local_5b0 + 8));
      local_140.__r = local_958.__r;
      local_8d0 = output;
      local_8c8 = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_728);
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      ppcVar18 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      ppcVar4 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      local_c8 = local_728;
      local_c0 = local_728;
      if (ppcVar18 != ppcVar4) {
        do {
          local_960._M_head_impl = (SaveRestoreEnvironment *)*ppcVar18;
          if (local_960._M_head_impl != (SaveRestoreEnvironment *)0x0) {
            iVar9 = strcmp((char *)local_960._M_head_impl,"--build-generator");
            if ((iVar9 == 0) &&
               (((local_958.__r != 10000000.0 || (NAN(local_958.__r))) && (0.0 < local_958.__r)))) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const(&)[15]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_948,(char (*) [15])"--test-timeout");
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c0);
              cmDurationTo<unsigned_int>(&local_958);
              std::ostream::_M_insert<unsigned_long>((ulong)local_8c0);
              std::__cxx11::stringbuf::str();
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_948,&local_928);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_928._M_dataplus._M_p != &local_928.field_2) {
                operator_delete(local_928._M_dataplus._M_p,
                                local_928.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c0);
              std::ios_base::~ios_base(local_850);
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const*&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_948,(char **)&local_960);
          }
          ppcVar18 = ppcVar18 + 1;
        } while (ppcVar18 != ppcVar4);
      }
      poVar11 = local_8c8;
      if (local_8c8 != (ostream *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(local_8c8,"* Run internal CTest",0x14);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
      }
      psVar12 = local_8d0;
      local_960._M_head_impl = (SaveRestoreEnvironment *)0x0;
      if ((char)local_94c != '\0') {
        pSVar13 = (SaveRestoreEnvironment *)operator_new(0x18);
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar13);
        _Var5._M_head_impl = local_960._M_head_impl;
        local_8c0._0_8_ =
             (__uniq_ptr_impl<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
              )0x0;
        bVar8 = local_960._M_head_impl != (SaveRestoreEnvironment *)0x0;
        local_960._M_head_impl = pSVar13;
        if (bVar8) {
          cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(_Var5._M_head_impl);
          operator_delete(_Var5._M_head_impl,0x18);
        }
        std::
        unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
        ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                       *)local_8c0);
        cmSystemTools::AppendEnv
                  ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_968);
      }
      iVar9 = Run((cmCTest *)local_5b0,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_948,psVar12);
      *local_900 = iVar9;
      if (psVar12 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::_M_append((char *)psVar12,local_8c0._0_8_);
        if ((SaveRestoreEnvironment *)local_8c0._0_8_ != local_8b0) {
          operator_delete((void *)local_8c0._0_8_,
                          (ulong)((long)&((local_8b0[0].Env.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + 1));
        }
      }
      if (poVar11 != (ostream *)0x0 && psVar12 != (string *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
      }
      if (psVar12 != (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_8c0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_8c0,"Internal cmCTest object used to run test.",0x29);
        std::ios::widen((char)(ostream *)local_8c0 +
                        (char)(((SaveRestoreEnvironment *)(local_8c0._0_8_ + -0x18))->Env).
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
        std::ostream::put((char)local_8c0);
        poVar11 = (ostream *)std::ostream::flush();
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            (poVar11,(psVar12->_M_dataplus)._M_p,psVar12->_M_string_length);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        std::__cxx11::stringbuf::str();
        Log(local_970,5,
            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx"
            ,0x4b8,local_928._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_928._M_dataplus._M_p != &local_928.field_2) {
          operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_8c0);
        std::ios_base::~ios_base(local_850);
      }
      std::
      unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
      ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                     *)&local_960);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_948);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_728);
      std::ios_base::~ios_base(local_6b8);
      ~cmCTest((cmCTest *)local_5b0);
      return 4;
    }
  }
  else if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_5b0._0_8_ != local_5a0) {
    operator_delete((void *)local_5b0._0_8_,local_5a0[0]._M_allocated_capacity + 1);
  }
  local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    output->_M_string_length = 0;
    *(output->_M_dataplus)._M_p = '\0';
  }
  local_960._M_head_impl = (SaveRestoreEnvironment *)0x0;
  if ((char)local_94c != '\0') {
    pSVar13 = (SaveRestoreEnvironment *)operator_new(0x18);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar13);
    _Var5._M_head_impl = local_960._M_head_impl;
    local_5b0._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    bVar8 = local_960._M_head_impl != (SaveRestoreEnvironment *)0x0;
    local_960._M_head_impl = pSVar13;
    if (bVar8) {
      cmSystemTools::SaveRestoreEnvironment::~SaveRestoreEnvironment(_Var5._M_head_impl);
      operator_delete(_Var5._M_head_impl,0x18);
    }
    std::
    unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
    ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                   *)local_5b0);
    cmSystemTools::AppendEnv
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_968);
  }
  pcVar14 = cmsysProcess_New();
  cmsysProcess_SetCommand
            (pcVar14,(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl
                     .super__Vector_impl_data._M_start);
  local_968 = pcVar14;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,"Command is: ",0xc);
  __s = *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_978 + *(long *)(local_5b0._0_8_ + -0x18)) + 0x3c8);
  }
  else {
    sVar15 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_5b0,__s,sVar15);
  }
  std::ios::widen((char)(ostream *)local_5b0 + (char)*(undefined8 *)(local_5b0._0_8_ + -0x18));
  std::ostream::put((char)local_5b0);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_970,0,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x4ca,local_728[0]._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_728[0]._M_dataplus._M_p,
                    CONCAT71(local_728[0].field_2._M_allocated_capacity._1_7_,
                             local_728[0].field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  pcVar14 = local_968;
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(local_968,0,1);
  }
  cmsysProcess_SetTimeout(pcVar14,local_958.__r);
  cmsysProcess_Execute(pcVar14);
  cmProcessOutput::cmProcessOutput(&local_971,encoding,0x400);
  local_728[0]._M_string_length = 0;
  local_728[0].field_2._M_local_buf[0] = '\0';
  local_728[0]._M_dataplus._M_p = (pointer)paVar1;
  while (iVar9 = cmsysProcess_WaitForData(local_968,&local_8d8,&local_904,(double *)0x0), iVar9 != 0
        ) {
    cmProcessOutput::DecodeText(&local_971,local_8d8,(long)local_904,local_728,0);
    if (output != (string *)0x0) {
      std::vector<char,std::allocator<char>>::_M_range_insert<char*>
                ((vector<char,std::allocator<char>> *)&local_948,
                 local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,local_8d8,local_8d8 + local_904);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
    if (local_728[0]._M_string_length != 0) {
      std::ostream::write((char *)local_5b0,(long)local_728[0]._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_970,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x4dc,(char *)local_8c0._0_8_,false);
    if ((SaveRestoreEnvironment *)local_8c0._0_8_ != local_8b0) {
      operator_delete((void *)local_8c0._0_8_,
                      (ulong)((long)&((local_8b0[0].Env.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    if (log != (ostream *)0x0) {
      std::ostream::write((char *)log,(long)local_728[0]._M_dataplus._M_p);
    }
  }
  local_748._M_string_length = 0;
  local_748.field_2._M_local_buf[0] = '\0';
  local_748._M_dataplus._M_p = (pointer)&local_748.field_2;
  cmProcessOutput::DecodeText(&local_971,&local_748,local_728,0);
  pcVar14 = local_968;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748._M_dataplus._M_p != &local_748.field_2) {
    operator_delete(local_748._M_dataplus._M_p,
                    CONCAT71(local_748.field_2._M_allocated_capacity._1_7_,
                             local_748.field_2._M_local_buf[0]) + 1);
  }
  if (local_728[0]._M_string_length != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
    if (local_728[0]._M_string_length != 0) {
      std::ostream::write(local_5b0,(long)local_728[0]._M_dataplus._M_p);
      std::ostream::flush();
    }
    std::__cxx11::stringbuf::str();
    Log(local_970,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x4e4,(char *)local_8c0._0_8_,false);
    if ((SaveRestoreEnvironment *)local_8c0._0_8_ != local_8b0) {
      operator_delete((void *)local_8c0._0_8_,
                      (ulong)((long)&((local_8b0[0].Env.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + 1));
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
    std::ios_base::~ios_base(local_540);
    if (log != (ostream *)0x0) {
      std::ostream::write((char *)log,(long)local_728[0]._M_dataplus._M_p);
    }
  }
  cmsysProcess_WaitForExit(pcVar14,(double *)0x0);
  local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  uVar17 = (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  if (uVar17 == 0) {
    __dest = (pointer)0x0;
  }
  else {
    if ((long)uVar17 < 0) {
      std::__throw_bad_alloc();
    }
    __dest = (pointer)operator_new(uVar17);
  }
  local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __dest + uVar17;
  sVar15 = (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
  local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = __dest;
  if (sVar15 != 0) {
    local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = __dest;
    memmove(__dest,local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar15);
  }
  local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = __dest + sVar15;
  cmProcessOutput::DecodeText(&local_971,&local_8f8,&local_948,0);
  if (local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_8f8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((output != (string *)0x0) &&
     (local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)output,
               (ulong)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_5b0,"-- Process completed",0x14);
  std::ios::widen((char)(ostream *)local_5b0 + (char)*(undefined8 *)(local_5b0._0_8_ + -0x18));
  std::ostream::put((char)local_5b0);
  std::ostream::flush();
  std::__cxx11::stringbuf::str();
  Log(local_970,5,
      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
      0x4f0,(char *)local_8c0._0_8_,false);
  if ((SaveRestoreEnvironment *)local_8c0._0_8_ != local_8b0) {
    operator_delete((void *)local_8c0._0_8_,
                    (ulong)((long)&((local_8b0[0].Env.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           1));
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  iVar9 = cmsysProcess_GetState(pcVar14);
  if (iVar9 == 1) {
    local_8c0._0_8_ = local_8b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c0,"\n*** ERROR executing: ","");
    cmsysProcess_GetErrorString(local_968);
    std::__cxx11::string::append(local_8c0);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,local_8c0._0_8_);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b0,(char *)local_8c0._0_8_,local_8c0._8_8_);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_970,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x50e,local_928._M_dataplus._M_p,false);
  }
  else {
    if (iVar9 != 2) {
      if (iVar9 == 4) {
        iVar10 = cmsysProcess_GetExitValue(local_968);
        *local_900 = iVar10;
        if ((iVar10 != 0) && (local_970->OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(local_970,&local_948);
        }
      }
      goto LAB_0014f881;
    }
    if (local_970->OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(local_970,&local_948);
    }
    iVar10 = cmsysProcess_GetExitException(local_968);
    *local_900 = iVar10;
    local_8c0._0_8_ = local_8b0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_8c0,"\n*** Exception executing: ","");
    cmsysProcess_GetExceptionString(local_968);
    std::__cxx11::string::append(local_8c0);
    if (output != (string *)0x0) {
      std::__cxx11::string::_M_append((char *)output,local_8c0._0_8_);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_5b0,(char *)local_8c0._0_8_,local_8c0._8_8_);
    std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(local_970,5,
        "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmCTest.cxx",
        0x505,local_928._M_dataplus._M_p,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928._M_dataplus._M_p != &local_928.field_2) {
    operator_delete(local_928._M_dataplus._M_p,local_928.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
  std::ios_base::~ios_base(local_540);
  if ((SaveRestoreEnvironment *)local_8c0._0_8_ != local_8b0) {
    operator_delete((void *)local_8c0._0_8_,
                    (ulong)((long)&((local_8b0[0].Env.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           1));
  }
LAB_0014f881:
  cmsysProcess_Delete(local_968);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_728[0]._M_dataplus._M_p != &local_728[0].field_2) {
    operator_delete(local_728[0]._M_dataplus._M_p,
                    CONCAT71(local_728[0].field_2._M_allocated_capacity._1_7_,
                             local_728[0].field_2._M_local_buf[0]) + 1);
  }
  cmProcessOutput::~cmProcessOutput(&local_971);
  std::
  unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
  ::~unique_ptr((unique_ptr<cmSystemTools::SaveRestoreEnvironment,_std::default_delete<cmSystemTools::SaveRestoreEnvironment>_>
                 *)&local_960);
  if (local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_948.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return iVar9;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv, std::string* output,
                     int* retVal, std::ostream* log, cmDuration testTimeOut,
                     std::vector<std::string>* environment, Encoding encoding)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  cmDuration timeout = this->GetRemainingTimeAllowed();
  if (timeout != cmCTest::MaxDuration()) {
    timeout -= std::chrono::minutes(2);
  }
  if (this->TimeOut > cmDuration::zero() && this->TimeOut < timeout) {
    timeout = this->TimeOut;
  }
  if (testTimeOut > cmDuration::zero() &&
      testTimeOut < this->GetRemainingTimeAllowed()) {
    timeout = testTimeOut;
  }

  // always have at least 1 second if we got to here
  if (timeout <= cmDuration::zero()) {
    timeout = std::chrono::seconds(1);
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: "
               << (timeout == cmCTest::MaxDuration()
                     ? std::string("infinite")
                     : std::to_string(cmDurationTo<unsigned int>(timeout)))
               << "\n");
  if (cmSystemTools::SameFile(argv[0], cmSystemTools::GetCTestCommand()) &&
      !this->ForceNewCTestProcess) {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for (char const* i : argv) {
      if (i) {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(i, "--build-generator") == 0 &&
            timeout != cmCTest::MaxDuration() &&
            timeout > cmDuration::zero()) {
          args.emplace_back("--test-timeout");
          std::ostringstream msg;
          msg << cmDurationTo<unsigned int>(timeout);
          args.push_back(msg.str());
        }
        args.emplace_back(i);
      }
    }
    if (log) {
      *log << "* Run internal CTest" << std::endl;
    }

    std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv) {
      saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
      cmSystemTools::AppendEnv(*environment);
    }

    *retVal = inst.Run(args, output);
    if (output) {
      *output += oss.str();
    }
    if (log && output) {
      *log << *output;
    }
    if (output) {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                                                             << *output
                                                             << std::endl);
    }

    return cmsysProcess_State_Exited;
  }
  std::vector<char> tempOutput;
  if (output) {
    output->clear();
  }

  std::unique_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv) {
    saveEnv = cm::make_unique<cmSystemTools::SaveRestoreEnvironment>();
    cmSystemTools::AppendEnv(*environment);
  }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, argv.data());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if (cmSystemTools::GetRunCommandHideConsole()) {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
  }

  cmsysProcess_SetTimeout(cp, timeout.count());
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while (cmsysProcess_WaitForData(cp, &data, &length, nullptr)) {
    processOutput.DecodeText(data, length, strdata);
    if (output) {
      tempOutput.insert(tempOutput.end(), data, data + length);
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }
  processOutput.DecodeText(std::string(), strdata);
  if (!strdata.empty()) {
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               cmCTestLogWrite(strdata.c_str(), strdata.size()));
    if (log) {
      log->write(strdata.c_str(), strdata.size());
    }
  }

  cmsysProcess_WaitForExit(cp, nullptr);
  processOutput.DecodeText(tempOutput, tempOutput);
  if (output && tempOutput.begin() != tempOutput.end()) {
    output->append(tempOutput.data(), tempOutput.size());
  }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "-- Process completed" << std::endl);

  int result = cmsysProcess_GetState(cp);

  if (result == cmsysProcess_State_Exited) {
    *retVal = cmsysProcess_GetExitValue(cp);
    if (*retVal != 0 && this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
  } else if (result == cmsysProcess_State_Exception) {
    if (this->OutputTestOutputOnTestFailure) {
      OutputTestErrors(tempOutput);
    }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  } else if (result == cmsysProcess_State_Error) {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if (output) {
      *output += outerr;
    }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
               outerr << std::endl
                      << std::flush);
  }
  cmsysProcess_Delete(cp);

  return result;
}